

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_argsort(ggml_context *ctx,ggml_tensor *a,ggml_sort_order order)

{
  ggml_tensor *pgVar1;
  
  if (a->ne[0] < 0x80000000) {
    pgVar1 = ggml_new_tensor(ctx,GGML_TYPE_I32,4,a->ne);
    pgVar1->op_params[0] = order;
    pgVar1->op = GGML_OP_ARGSORT;
    pgVar1->src[0] = a;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x110d,
             "GGML_ASSERT(%s) failed","a->ne[0] <= INT32_MAX");
}

Assistant:

struct ggml_tensor * ggml_argsort(
        struct ggml_context  * ctx,
        struct ggml_tensor   * a,
        enum ggml_sort_order   order) {
    GGML_ASSERT(a->ne[0] <= INT32_MAX);
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_I32, GGML_MAX_DIMS, a->ne);

    ggml_set_op_params_i32(result, 0, (int32_t) order);

    result->op     = GGML_OP_ARGSORT;
    result->src[0] = a;

    return result;
}